

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl.cpp
# Opt level: O2

Response * __thiscall
arbiter::http::Curl::head
          (Response *__return_storage_ptr__,Curl *this,string *path,Headers *headers,Query *query,
          size_t timeout)

{
  int code;
  vector<char,_std::allocator<char>_> data;
  string local_78 [32];
  Headers receivedHeaders;
  
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string(local_78,(string *)path);
  init(this,(EVP_PKEY_CTX *)local_78);
  ::std::__cxx11::string::~string(local_78);
  if (timeout != 0) {
    curl_easy_setopt(this->m_curl,0x14,timeout);
  }
  curl_easy_setopt(this->m_curl,0x4e2b,anon_unknown_4::getCb);
  curl_easy_setopt(this->m_curl,0x2711,&data);
  curl_easy_setopt(this->m_curl,0x2727,this->m_headers);
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       receivedHeaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  curl_easy_setopt(this->m_curl,0x4e6f,anon_unknown_4::headerCb);
  curl_easy_setopt(this->m_curl,0x272d,&receivedHeaders);
  curl_easy_setopt(this->m_curl,0x2c,1);
  code = perform(this);
  Response::Response(__return_storage_ptr__,code,&data,&receivedHeaders);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&receivedHeaders._M_t);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&data.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

Response Curl::head(
    std::string path,
    Headers headers,
    Query query,
    const std::size_t timeout)
{
#ifdef ARBITER_CURL
    std::vector<char> data;

    init(path, headers, query);
    if (timeout) curl_easy_setopt(m_curl, CURLOPT_LOW_SPEED_TIME, timeout);

    // Register callback function and data pointer to consume the result.
    curl_easy_setopt(m_curl, CURLOPT_WRITEFUNCTION, getCb);
    curl_easy_setopt(m_curl, CURLOPT_WRITEDATA, &data);

    // Insert all headers into the request.
    curl_easy_setopt(m_curl, CURLOPT_HTTPHEADER, m_headers);

    // Set up callback and data pointer for received headers.
    Headers receivedHeaders;
    curl_easy_setopt(m_curl, CURLOPT_HEADERFUNCTION, headerCb);
    curl_easy_setopt(m_curl, CURLOPT_HEADERDATA, &receivedHeaders);

    // Specify a HEAD request.
    curl_easy_setopt(m_curl, CURLOPT_NOBODY, 1L);

    // Run the command.
    const int httpCode(perform());
    return Response(httpCode, data, receivedHeaders);
#else
    throw ArbiterError(fail);
#endif
}